

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

ssize_t __thiscall
boost::deflate::inflate_stream_test::ZlibDecompressor::write
          (ZlibDecompressor *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  bad_alloc *this_00;
  runtime_error *this_01;
  int res;
  int zlib_flush;
  Flush flush_local;
  ZlibDecompressor *this_local;
  
  iVar1 = inflate(&this->zs,write::zlib_flushes[__fd]);
  switch(iVar1) {
  case 0:
    system::error_code::error_code((error_code *)&this_local);
    break;
  case 1:
    system::error_code::error_code<boost::deflate::error>
              ((error_code *)&this_local,end_of_stream,(type *)0x0);
    break;
  case 2:
    system::error_code::error_code<boost::deflate::error>
              ((error_code *)&this_local,need_dict,(type *)0x0);
    break;
  case -5:
    system::error_code::error_code<boost::deflate::error>
              ((error_code *)&this_local,need_buffers,(type *)0x0);
    break;
  case -4:
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  case -3:
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid stored block lengths"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,invalid_stored_length,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid block type"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,invalid_block_type,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"too many length or distance symbols"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,too_many_symbols,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid code lengths set"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,incomplete_length_set,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid literal/lengths set"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,over_subscribed_length,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid literal/length code"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,invalid_literal_length,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid distance code"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,invalid_distance_code,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid distance too far back"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,invalid_distance,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid bit length repeat"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,invalid_bit_length_repeat,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid code -- missing end-of-block"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,missing_eob,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"unknown compression method"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,unknown_compression_method,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"invalid window size"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,invalid_window_size,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"incorrect header check"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,incorrect_header_check,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"incorrect data check"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,incorrect_data_check,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"incorrect length check"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,incorrect_length_check,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"header crc mismatch"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,header_crc_mismatch,(type *)0x0);
      return (ssize_t)this_local;
    }
    if (((this->zs).msg != (char *)0x0) &&
       (iVar1 = strcmp((this->zs).msg,"unknown header flags set"), iVar1 == 0)) {
      system::error_code::error_code<boost::deflate::error>
                ((error_code *)&this_local,unknown_header_flags,(type *)0x0);
      return (ssize_t)this_local;
    }
  case -2:
    system::error_code::error_code<boost::deflate::error>
              ((error_code *)&this_local,stream_error,(type *)0x0);
    break;
  default:
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"zlib decompressor: impossible value");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return (ssize_t)this_local;
}

Assistant:

error_code write(Flush flush) override {
            constexpr static int zlib_flushes[] = {0, Z_BLOCK, Z_PARTIAL_FLUSH, Z_SYNC_FLUSH, Z_FULL_FLUSH, Z_FINISH, Z_TREES};
            const auto zlib_flush = zlib_flushes[static_cast<int>(flush)];
            const auto res = ::inflate(&zs, zlib_flush);
            switch(res){
            case Z_OK:
              return {};
            case Z_STREAM_END:
              return error::end_of_stream;
            case Z_NEED_DICT:
              return error::need_dict;
            case Z_DATA_ERROR:
                if(zs.msg && !std::strcmp(zs.msg, "invalid stored block lengths"))
                    return error::invalid_stored_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid block type"))
                    return error::invalid_block_type;
                if(zs.msg && !std::strcmp(zs.msg, "too many length or distance symbols"))
                    return error::too_many_symbols;
                if(zs.msg && !std::strcmp(zs.msg, "invalid code lengths set"))
                    return error::incomplete_length_set;
                if(zs.msg && !std::strcmp(zs.msg, "invalid literal/lengths set"))
                    return error::over_subscribed_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid literal/length code"))
                    return error::invalid_literal_length;
                if(zs.msg && !std::strcmp(zs.msg, "invalid distance code"))
                    return error::invalid_distance_code;
                if(zs.msg && !std::strcmp(zs.msg, "invalid distance too far back"))
                    return error::invalid_distance;
                if(zs.msg && !std::strcmp(zs.msg, "invalid bit length repeat"))
                    return error::invalid_bit_length_repeat;
                if(zs.msg && !std::strcmp(zs.msg, "invalid code -- missing end-of-block"))
                    return error::missing_eob;
                if(zs.msg && !std::strcmp(zs.msg, "unknown compression method"))
                    return error::unknown_compression_method;
                if(zs.msg && !std::strcmp(zs.msg, "invalid window size"))
                        return error::invalid_window_size;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect header check"))
                        return error::incorrect_header_check;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect data check"))
                    return error::incorrect_data_check;
                if(zs.msg && !std::strcmp(zs.msg, "incorrect length check"))
                    return error::incorrect_length_check;
                if(zs.msg && !std::strcmp(zs.msg, "header crc mismatch"))
                    return error::header_crc_mismatch;
                if(zs.msg && !std::strcmp(zs.msg, "unknown header flags set"))
                    return error::unknown_header_flags;
                BOOST_FALLTHROUGH;
            case Z_STREAM_ERROR:
              return error::stream_error;
            case Z_MEM_ERROR:
              throw std::bad_alloc{};
            case Z_BUF_ERROR:
              return error::need_buffers;
            default:
              throw std::runtime_error{"zlib decompressor: impossible value"};
            }
        }